

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O2

void OpenURL(char *url)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  
  pcVar2 = strchr(url,0x27);
  if (pcVar2 != (char *)0x0) {
    TraceLog(4,"SYSTEM: Provided URL could be potentially malicious, avoid [\'] character");
    return;
  }
  sVar3 = strlen(url);
  pcVar2 = (char *)calloc(sVar3 + 0x20,1);
  sprintf(pcVar2,"xdg-open \'%s\'",url);
  iVar1 = system(pcVar2);
  if (iVar1 == -1) {
    TraceLog(4,"OpenURL() child process could not be created");
  }
  free(pcVar2);
  return;
}

Assistant:

void OpenURL(const char *url)
{
    // Security check to (partially) avoid malicious code
    if (strchr(url, '\'') != NULL) TRACELOG(LOG_WARNING, "SYSTEM: Provided URL could be potentially malicious, avoid [\'] character");
    else
    {
        char *cmd = (char *)RL_CALLOC(strlen(url) + 32, sizeof(char));
#if defined(_WIN32)
        sprintf(cmd, "explorer \"%s\"", url);
#endif
#if defined(__linux__) || defined(__FreeBSD__) || defined(__OpenBSD__)
        sprintf(cmd, "xdg-open '%s'", url); // Alternatives: firefox, x-www-browser
#endif
#if defined(__APPLE__)
        sprintf(cmd, "open '%s'", url);
#endif
        int result = system(cmd);
        if (result == -1) TRACELOG(LOG_WARNING, "OpenURL() child process could not be created");
        RL_FREE(cmd);
    }
}